

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

int cram_byte_array_stop_decode_char
              (cram_slice *slice,cram_codec *c,cram_block *in,char *out,int *out_size)

{
  uint uVar1;
  int iVar2;
  cram_block *pcVar3;
  uchar *puVar4;
  uchar *puVar5;
  ulong uVar6;
  ulong uVar7;
  
  iVar2 = -1;
  if (slice->block_by_id == (cram_block **)0x0) {
    uVar1 = slice->hdr->num_blocks;
    uVar7 = 0;
    uVar6 = 0;
    if (0 < (int)uVar1) {
      uVar6 = (ulong)uVar1;
    }
    pcVar3 = (cram_block *)0x0;
    for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      pcVar3 = slice->block[uVar7];
      if (((pcVar3 != (cram_block *)0x0) && (pcVar3->content_type == EXTERNAL)) &&
         (pcVar3->content_id == (c->field_6).external.type)) {
        uVar6 = uVar7 & 0xffffffff;
        break;
      }
    }
    if ((uint)uVar6 == uVar1) {
      return -1;
    }
    if (pcVar3 == (cram_block *)0x0) {
      return -1;
    }
  }
  else {
    pcVar3 = slice->block_by_id[(c->field_6).beta.nbits];
    if (pcVar3 == (cram_block *)0x0) {
      return -(uint)(*out_size != 0);
    }
  }
  if (pcVar3->idx < pcVar3->uncomp_size) {
    puVar4 = pcVar3->data + pcVar3->idx;
    puVar5 = puVar4;
    while( true ) {
      if (*puVar5 == (c->field_6).byte_array_stop.stop) break;
      if ((long)pcVar3->uncomp_size <= (long)puVar4 - (long)pcVar3->data) {
        return -1;
      }
      *out = *puVar5;
      out = (char *)((uchar *)out + 1);
      puVar5 = puVar5 + 1;
      puVar4 = puVar4 + 1;
    }
    iVar2 = (int)pcVar3->data;
    *out_size = (int)puVar4 - (pcVar3->idx + iVar2);
    pcVar3->idx = ((int)puVar4 - iVar2) + 1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int cram_byte_array_stop_decode_char(cram_slice *slice, cram_codec *c,
					    cram_block *in, char *out,
					    int *out_size) {
    int i;
    cram_block *b = NULL;
    char *cp, ch;

    if (slice->block_by_id) {
	if (!(b = slice->block_by_id[c->byte_array_stop.content_id]))
	    return *out_size?-1:0;
    } else {
	for (i = 0; i < slice->hdr->num_blocks; i++) {
	    b = slice->block[i];
	    if (b && b->content_type == EXTERNAL &&
		b->content_id == c->byte_array_stop.content_id) {
		break;
	    }
	}
	if (i == slice->hdr->num_blocks || !b)
	    return -1;
    }

    if (b->idx >= b->uncomp_size)
	return -1;

    cp = (char *)b->data + b->idx;
    while ((ch = *cp) != (char)c->byte_array_stop.stop) {
	if (cp - (char *)b->data >= b->uncomp_size)
	    return -1;
	*out++ = ch;
	cp++;
    }

    *out_size = cp - (char *)(b->data + b->idx);
    b->idx = cp - (char *)b->data + 1;

    return 0;
}